

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtabletmanager.cpp
# Opt level: O1

void __thiscall QEvdevTabletManager::addDevice(QEvdevTabletManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  QEvdevTabletHandlerThread *this_00;
  long lVar3;
  long in_FS_OFFSET;
  QEvdevTabletHandlerThread *local_50;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevTablet();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = pQVar1->name;
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    uVar2 = QString::utf16();
    QMessageLogger::debug(local_48,"Adding device at %ls",uVar2);
  }
  this_00 = (QEvdevTabletHandlerThread *)operator_new(0x48);
  QEvdevTabletHandlerThread::QEvdevTabletHandlerThread
            (this_00,deviceNode,&this->m_spec,(QObject *)0x0);
  local_50 = this_00;
  QtInputSupport::DeviceHandlerList<QEvdevTabletHandlerThread>::add
            (&this->m_activeDevices,deviceNode,
             (unique_ptr<QEvdevTabletHandlerThread,_std::default_delete<QEvdevTabletHandlerThread>_>
             )&local_50);
  if (local_50 != (QEvdevTabletHandlerThread *)0x0) {
    (**(code **)(*(long *)local_50 + 0x20))();
  }
  local_50 = (QEvdevTabletHandlerThread *)0x0;
  lVar3 = QGuiApplicationPrivate::inputDeviceManager();
  QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar3 + 8),4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevTabletManager::addDevice(const QString &deviceNode)
{
    qCDebug(qLcEvdevTablet, "Adding device at %ls", qUtf16Printable(deviceNode));
    auto handler = std::make_unique<QEvdevTabletHandlerThread>(deviceNode, m_spec);
    if (handler) {
        m_activeDevices.add(deviceNode, std::move(handler));
        updateDeviceCount();
    } else {
        qWarning("evdevtablet: Failed to open tablet device %ls", qUtf16Printable(deviceNode));
    }
}